

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O2

void __thiscall argsman_tests::util_ParseParameters::test_method(util_ParseParameters *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  *this_00;
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  size_type sVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  string *psVar10;
  iterator pvVar11;
  iterator pvVar12;
  long lVar13;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  check_type cVar14;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  allocator<char> local_7b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7b8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  lazy_ostream local_680;
  undefined1 *local_670;
  allocator<char> *local_668;
  allocator<char> local_65c;
  allocator<char> local_65b;
  allocator<char> local_65a;
  allocator<char> local_659;
  assertion_result local_658;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  allocator<char> local_60c;
  allocator<char> local_60b;
  allocator<char> local_60a;
  allocator<char> local_609;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  pair<const_char_*,_ArgsManager::Flags> local_4b8;
  pair<const_char_*,_ArgsManager::Flags> local_4a8;
  pair<const_char_*,_ArgsManager::Flags> local_498;
  pair<const_char_*,_ArgsManager::Flags> local_488;
  key_type local_478;
  key_type local_458;
  key_type local_438;
  undefined1 local_418 [16];
  undefined1 *local_408;
  undefined8 local_400;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  undefined1 local_378 [16];
  undefined1 *local_368;
  undefined8 local_360;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_350;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_328;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_300;
  string error;
  char *argv_test [7];
  TestArgsManager testArgs;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestArgsManager::TestArgsManager(&testArgs);
  local_488.first = "-a";
  local_4b8.second = ALLOW_ANY;
  local_498.first = "-b";
  local_4a8.first = "-ccc";
  local_4b8.first = "-d";
  argv_test[6] = "-d=e";
  argv_test[4] = "-ccc=multiple";
  argv_test[5] = "f";
  argv_test[2] = "-b";
  argv_test[3] = "-ccc=argument";
  argv_test[0] = "-ignored";
  argv_test[1] = "-a";
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  pvVar11 = (iterator)0xdc;
  pvVar12 = (iterator)0x0;
  local_4a8.second = local_4b8.second;
  local_498.second = local_4b8.second;
  local_488.second = local_4b8.second;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock9,(AnnotatedMixin<std::recursive_mutex> *)&testArgs,"testArgs.cs_args",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp"
             ,0xdc,false);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)local_378,&local_488);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_350,&local_498);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_328,&local_4a8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_300,&local_4b8);
  __l._M_len = 4;
  __l._M_array = (iterator)local_378;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)&local_398,__l,(allocator_type *)&local_3b8);
  TestArgsManager::SetupArgs
            (&testArgs,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)&local_398);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&local_398);
  lVar13 = 0x78;
  do {
    std::__cxx11::string::~string((string *)(local_378 + lVar13));
    lVar13 = lVar13 + -0x28;
  } while (lVar13 != -0x28);
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xde;
  file.m_begin = (iterator)&local_4d8;
  msg.m_end = pvVar12;
  msg.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_4e8,msg);
  local_398._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&testArgs.super_ArgsManager,0,argv_test,&error);
  local_398._M_string_length = 0;
  local_398.field_2._M_allocated_capacity = 0;
  local_3b8._M_dataplus._M_p = "testArgs.ParseParameters(0, argv_test, error)";
  local_3b8._M_string_length = 0xb685d5;
  local_378[8] = false;
  local_378._0_8_ = &PTR__lazy_ostream_011481f0;
  local_368 = boost::unit_test::lazy_ostream::inst;
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_4f0 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_360 = &local_3b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_398,(lazy_ostream *)local_378,1,0,WARN,_cVar14,
             (size_t)&local_4f8,0xde);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_398.field_2._M_allocated_capacity);
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xdf;
  file_00.m_begin = (iterator)&local_508;
  msg_00.m_end = pvVar12;
  msg_00.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_518,
             msg_00);
  local_398._M_dataplus._M_p._0_1_ =
       testArgs.super_ArgsManager.m_settings.ro_config._M_t._M_impl.super__Rb_tree_header.
       _M_node_count == 0 &&
       testArgs.super_ArgsManager.m_settings.command_line_options._M_t._M_impl.super__Rb_tree_header
       ._M_node_count == 0;
  local_398._M_string_length = 0;
  local_398.field_2._M_allocated_capacity = 0;
  local_3b8._M_dataplus._M_p =
       "testArgs.m_settings.command_line_options.empty() && testArgs.m_settings.ro_config.empty()";
  local_3b8._M_string_length = 0xb6862f;
  local_378[8] = false;
  local_378._0_8_ = &PTR__lazy_ostream_011481f0;
  local_368 = boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_520 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_360 = &local_3b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_398,(lazy_ostream *)local_378,1,0,WARN,_cVar14,
             (size_t)&local_528,0xdf);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_398.field_2._M_allocated_capacity);
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xe1;
  file_01.m_begin = (iterator)&local_538;
  msg_01.m_end = pvVar12;
  msg_01.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_548,
             msg_01);
  local_398._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&testArgs.super_ArgsManager,1,argv_test,&error);
  local_398._M_string_length = 0;
  local_398.field_2._M_allocated_capacity = 0;
  local_3b8._M_dataplus._M_p = "testArgs.ParseParameters(1, argv_test, error)";
  local_3b8._M_string_length = 0xb6865d;
  local_378[8] = false;
  local_378._0_8_ = &PTR__lazy_ostream_011481f0;
  local_368 = boost::unit_test::lazy_ostream::inst;
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_550 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_360 = &local_3b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_398,(lazy_ostream *)local_378,1,0,WARN,_cVar14,
             (size_t)&local_558,0xe1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_398.field_2._M_allocated_capacity);
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xe2;
  file_02.m_begin = (iterator)&local_568;
  msg_02.m_end = pvVar12;
  msg_02.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_578,
             msg_02);
  local_398._M_dataplus._M_p._0_1_ =
       testArgs.super_ArgsManager.m_settings.ro_config._M_t._M_impl.super__Rb_tree_header.
       _M_node_count == 0 &&
       testArgs.super_ArgsManager.m_settings.command_line_options._M_t._M_impl.super__Rb_tree_header
       ._M_node_count == 0;
  local_398._M_string_length = 0;
  local_398.field_2._M_allocated_capacity = 0;
  local_3b8._M_dataplus._M_p =
       "testArgs.m_settings.command_line_options.empty() && testArgs.m_settings.ro_config.empty()";
  local_3b8._M_string_length = 0xb6862f;
  local_378[8] = false;
  local_378._0_8_ = &PTR__lazy_ostream_011481f0;
  local_368 = boost::unit_test::lazy_ostream::inst;
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_580 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_360 = &local_3b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_398,(lazy_ostream *)local_378,1,0,WARN,_cVar14,
             (size_t)&local_588,0xe2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_398.field_2._M_allocated_capacity);
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xe4;
  file_03.m_begin = (iterator)&local_598;
  msg_03.m_end = pvVar12;
  msg_03.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_5a8,
             msg_03);
  local_398._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&testArgs.super_ArgsManager,7,argv_test,&error);
  local_398._M_string_length = 0;
  local_398.field_2._M_allocated_capacity = 0;
  local_3b8._M_dataplus._M_p = "testArgs.ParseParameters(7, argv_test, error)";
  local_3b8._M_string_length = 0xb6868b;
  local_378[8] = false;
  local_378._0_8_ = &PTR__lazy_ostream_011481f0;
  local_368 = boost::unit_test::lazy_ostream::inst;
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5b0 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_360 = &local_3b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_398,(lazy_ostream *)local_378,1,0,WARN,_cVar14,
             (size_t)&local_5b8,0xe4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_398.field_2._M_allocated_capacity);
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xe8;
  file_04.m_begin = (iterator)&local_5c8;
  msg_04.m_end = pvVar12;
  msg_04.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_5d8,
             msg_04);
  local_398._M_dataplus._M_p._0_1_ =
       testArgs.super_ArgsManager.m_settings.command_line_options._M_t._M_impl.super__Rb_tree_header
       ._M_node_count == 3 &&
       testArgs.super_ArgsManager.m_settings.ro_config._M_t._M_impl.super__Rb_tree_header.
       _M_node_count == 0;
  local_398._M_string_length = 0;
  local_398.field_2._M_allocated_capacity = 0;
  local_3b8._M_dataplus._M_p =
       "testArgs.m_settings.command_line_options.size() == 3 && testArgs.m_settings.ro_config.empty()"
  ;
  local_3b8._M_string_length = 0xb686e9;
  local_378[8] = false;
  local_378._0_8_ = &PTR__lazy_ostream_011481f0;
  local_368 = boost::unit_test::lazy_ostream::inst;
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5e0 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_360 = &local_3b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_398,(lazy_ostream *)local_378,1,0,WARN,_cVar14,
             (size_t)&local_5e8,0xe8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_398.field_2._M_allocated_capacity);
  local_5f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xea;
  file_05.m_begin = (iterator)&local_5f8;
  msg_05.m_end = pvVar12;
  msg_05.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_608,
             msg_05);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_378,"-a",(allocator<char> *)&local_478);
  bVar4 = ArgsManager::IsArgSet(&testArgs.super_ArgsManager,(string *)local_378);
  bVar3 = false;
  bVar2 = false;
  bVar6 = false;
  local_438._M_dataplus._M_p._0_1_ = false;
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"-b",&local_609);
    bVar5 = ArgsManager::IsArgSet(&testArgs.super_ArgsManager,&local_398);
    bVar3 = false;
    bVar2 = false;
    bVar6 = false;
    local_438._M_dataplus._M_p._0_1_ = false;
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"-ccc",&local_60a);
      bVar6 = ArgsManager::IsArgSet(&testArgs.super_ArgsManager,&local_3b8);
      if (bVar6) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"f",&local_60b);
        bVar6 = ArgsManager::IsArgSet(&testArgs.super_ArgsManager,&local_3d8);
        if (!bVar6) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"-d",&local_60c);
          bVar6 = ArgsManager::IsArgSet(&testArgs.super_ArgsManager,&local_3f8);
          local_438._M_dataplus._M_p._0_1_ = !bVar6;
          bVar3 = true;
          bVar2 = true;
          bVar6 = true;
          goto LAB_002186b9;
        }
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      bVar3 = true;
      bVar6 = false;
      local_438._M_dataplus._M_p._0_1_ = false;
    }
  }
LAB_002186b9:
  local_438._M_string_length = 0;
  local_438.field_2._M_allocated_capacity = 0;
  local_400 = &local_458;
  local_458._M_dataplus._M_p =
       "testArgs.IsArgSet(\"-a\") && testArgs.IsArgSet(\"-b\") && testArgs.IsArgSet(\"-ccc\") && !testArgs.IsArgSet(\"f\") && !testArgs.IsArgSet(\"-d\")"
  ;
  local_458._M_string_length = 0xb68770;
  local_418[8] = false;
  local_418._0_8_ = &PTR__lazy_ostream_011481f0;
  local_408 = boost::unit_test::lazy_ostream::inst;
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_618 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_438,(lazy_ostream *)local_418,1,0,WARN,_cVar14,
             (size_t)&local_620,0xea);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_438.field_2._M_allocated_capacity);
  if (bVar6) {
    std::__cxx11::string::~string((string *)&local_3f8);
  }
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_3d8);
  }
  if (bVar3) {
    std::__cxx11::string::~string((string *)&local_3b8);
  }
  if (bVar4) {
    std::__cxx11::string::~string((string *)&local_398);
  }
  std::__cxx11::string::~string((string *)local_378);
  local_630 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_628 = "";
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xec;
  file_06.m_begin = (iterator)&local_630;
  msg_06.m_end = pvVar12;
  msg_06.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_640,
             msg_06);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_378,"a",(allocator<char> *)&local_7d0);
  this_00 = &testArgs.super_ArgsManager.m_settings.command_line_options;
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          ::count(this_00,(key_type *)local_378);
  if (sVar7 == 0) {
LAB_002188bf:
    bVar6 = false;
LAB_002188c5:
    bVar2 = false;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_418,"b",&local_659);
    sVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            ::count(this_00,(key_type *)local_418);
    if (sVar8 == 0) goto LAB_002188bf;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"ccc",&local_65a);
    sVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            ::count(this_00,&local_438);
    if (sVar8 == 0) {
      bVar6 = true;
      goto LAB_002188c5;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"f",&local_65b);
    sVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            ::count(this_00,&local_458);
    if (sVar8 == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"d",&local_65c);
      sVar8 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
              ::count(this_00,&local_478);
      local_658.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(sVar8 == 0);
      bVar6 = true;
      bVar2 = true;
      bVar3 = true;
      goto LAB_002188cc;
    }
    bVar6 = true;
    bVar2 = true;
  }
  bVar3 = false;
  local_658.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
LAB_002188cc:
  local_658.m_message.px = (element_type *)0x0;
  local_658.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb68771;
  local_7b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb68884;
  local_680.m_empty = false;
  local_680._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_670 = boost::unit_test::lazy_ostream::inst;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_688 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_668 = (allocator<char> *)&local_7b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_658,&local_680,1,0,WARN,_cVar14,(size_t)&local_690,0xec);
  boost::detail::shared_count::~shared_count(&local_658.m_message.pn);
  if (bVar3) {
    std::__cxx11::string::~string((string *)&local_478);
  }
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_458);
  }
  if (bVar6) {
    std::__cxx11::string::~string((string *)&local_438);
  }
  if (sVar7 != 0) {
    std::__cxx11::string::~string((string *)local_418);
  }
  std::__cxx11::string::~string((string *)local_378);
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_698 = "";
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xee;
  file_07.m_begin = (iterator)&local_6a0;
  msg_07.m_end = pvVar12;
  msg_07.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_6b0,
             msg_07);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_378,"a",(allocator<char> *)&local_7d0);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](this_00,(key_type *)local_378);
  local_658.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)(pmVar9->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pmVar9->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_start == 0x58);
  local_658.m_message.px = (element_type *)0x0;
  local_658.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb68885;
  local_7b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb688be;
  local_680.m_empty = false;
  local_680._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_670 = boost::unit_test::lazy_ostream::inst;
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_6b8 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_668 = (allocator<char> *)&local_7b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_658,&local_680,1,0,WARN,_cVar14,(size_t)&local_6c0,0xee);
  boost::detail::shared_count::~shared_count(&local_658.m_message.pn);
  std::__cxx11::string::~string((string *)local_378);
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_6c8 = "";
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xef;
  file_08.m_begin = (iterator)&local_6d0;
  msg_08.m_end = pvVar12;
  msg_08.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_6e0,
             msg_08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_378,"a",(allocator<char> *)&local_7d0);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](this_00,(key_type *)local_378);
  psVar10 = UniValue::get_str_abi_cxx11_
                      ((pmVar9->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                       super__Vector_impl_data._M_start);
  local_658.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)std::operator==(psVar10,"");
  local_658.m_message.px = (element_type *)0x0;
  local_658.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb688bf;
  local_7b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb68904;
  local_680.m_empty = false;
  local_680._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_670 = boost::unit_test::lazy_ostream::inst;
  local_6f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_6e8 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_668 = (allocator<char> *)&local_7b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_658,&local_680,1,0,WARN,_cVar14,(size_t)&local_6f0,0xef);
  boost::detail::shared_count::~shared_count(&local_658.m_message.pn);
  std::__cxx11::string::~string((string *)local_378);
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_6f8 = "";
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xf0;
  file_09.m_begin = (iterator)&local_700;
  msg_09.m_end = pvVar12;
  msg_09.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_710,
             msg_09);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_378,"ccc",(allocator<char> *)&local_7d0);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](this_00,(key_type *)local_378);
  local_658.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)(pmVar9->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pmVar9->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_start == 0xb0);
  local_658.m_message.px = (element_type *)0x0;
  local_658.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb68905;
  local_7b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb68940;
  local_680.m_empty = false;
  local_680._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_670 = boost::unit_test::lazy_ostream::inst;
  local_720 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_718 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_668 = (allocator<char> *)&local_7b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_658,&local_680,1,0,WARN,_cVar14,(size_t)&local_720,0xf0);
  boost::detail::shared_count::~shared_count(&local_658.m_message.pn);
  std::__cxx11::string::~string((string *)local_378);
  local_730 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_728 = "";
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xf1;
  file_10.m_begin = (iterator)&local_730;
  msg_10.m_end = pvVar12;
  msg_10.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_740,
             msg_10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_378,"ccc",(allocator<char> *)&local_7d0);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](this_00,(key_type *)local_378);
  psVar10 = UniValue::get_str_abi_cxx11_
                      ((pmVar9->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                       super__Vector_impl_data._M_start);
  local_658.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)std::operator==(psVar10,"argument");
  local_658.m_message.px = (element_type *)0x0;
  local_658.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb68941;
  local_7b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb68990;
  local_680.m_empty = false;
  local_680._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_670 = boost::unit_test::lazy_ostream::inst;
  local_750 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_748 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_668 = (allocator<char> *)&local_7b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_658,&local_680,1,0,WARN,_cVar14,(size_t)&local_750,0xf1);
  boost::detail::shared_count::~shared_count(&local_658.m_message.pn);
  std::__cxx11::string::~string((string *)local_378);
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_758 = "";
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xf2;
  file_11.m_begin = (iterator)&local_760;
  msg_11.m_end = pvVar12;
  msg_11.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_770,
             msg_11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_378,"ccc",(allocator<char> *)&local_7d0);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](this_00,(key_type *)local_378);
  psVar10 = UniValue::get_str_abi_cxx11_
                      ((pmVar9->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                       super__Vector_impl_data._M_finish + -1);
  local_658.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)std::operator==(psVar10,"multiple");
  local_658.m_message.px = (element_type *)0x0;
  local_658.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb68991;
  local_7b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb689df;
  local_680.m_empty = false;
  local_680._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_670 = boost::unit_test::lazy_ostream::inst;
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_778 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_668 = (allocator<char> *)&local_7b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_658,&local_680,1,0,WARN,_cVar14,(size_t)&local_780,0xf2);
  boost::detail::shared_count::~shared_count(&local_658.m_message.pn);
  std::__cxx11::string::~string((string *)local_378);
  local_790 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_788 = "";
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xf3;
  file_12.m_begin = (iterator)&local_790;
  msg_12.m_end = pvVar12;
  msg_12.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_7a0,
             msg_12);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_378,"-ccc",&local_7b9);
  ArgsManager::GetArgs(&local_7b8,&testArgs.super_ArgsManager,(string *)local_378);
  local_658.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)local_7b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_7b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x40);
  local_658.m_message.px = (element_type *)0x0;
  local_658.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7d0 = "testArgs.GetArgs(\"-ccc\").size() == 2";
  local_7c8 = "";
  local_680.m_empty = false;
  local_680._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_670 = boost::unit_test::lazy_ostream::inst;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_7d8 = "";
  local_668 = (allocator<char> *)&local_7d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_658,&local_680,1,0,WARN,_cVar14,(size_t)&local_7e0,0xf3);
  boost::detail::shared_count::~shared_count(&local_658.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_7b8);
  std::__cxx11::string::~string((string *)local_378);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock9.super_unique_lock);
  std::__cxx11::string::~string((string *)&error);
  ArgsManager::~ArgsManager(&testArgs.super_ArgsManager);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ParseParameters)
{
    TestArgsManager testArgs;
    const auto a = std::make_pair("-a", ArgsManager::ALLOW_ANY);
    const auto b = std::make_pair("-b", ArgsManager::ALLOW_ANY);
    const auto ccc = std::make_pair("-ccc", ArgsManager::ALLOW_ANY);
    const auto d = std::make_pair("-d", ArgsManager::ALLOW_ANY);

    const char *argv_test[] = {"-ignored", "-a", "-b", "-ccc=argument", "-ccc=multiple", "f", "-d=e"};

    std::string error;
    LOCK(testArgs.cs_args);
    testArgs.SetupArgs({a, b, ccc, d});
    BOOST_CHECK(testArgs.ParseParameters(0, argv_test, error));
    BOOST_CHECK(testArgs.m_settings.command_line_options.empty() && testArgs.m_settings.ro_config.empty());

    BOOST_CHECK(testArgs.ParseParameters(1, argv_test, error));
    BOOST_CHECK(testArgs.m_settings.command_line_options.empty() && testArgs.m_settings.ro_config.empty());

    BOOST_CHECK(testArgs.ParseParameters(7, argv_test, error));
    // expectation: -ignored is ignored (program name argument),
    // -a, -b and -ccc end up in map, -d ignored because it is after
    // a non-option argument (non-GNU option parsing)
    BOOST_CHECK(testArgs.m_settings.command_line_options.size() == 3 && testArgs.m_settings.ro_config.empty());
    BOOST_CHECK(testArgs.IsArgSet("-a") && testArgs.IsArgSet("-b") && testArgs.IsArgSet("-ccc")
                && !testArgs.IsArgSet("f") && !testArgs.IsArgSet("-d"));
    BOOST_CHECK(testArgs.m_settings.command_line_options.count("a") && testArgs.m_settings.command_line_options.count("b") && testArgs.m_settings.command_line_options.count("ccc")
                && !testArgs.m_settings.command_line_options.count("f") && !testArgs.m_settings.command_line_options.count("d"));

    BOOST_CHECK(testArgs.m_settings.command_line_options["a"].size() == 1);
    BOOST_CHECK(testArgs.m_settings.command_line_options["a"].front().get_str() == "");
    BOOST_CHECK(testArgs.m_settings.command_line_options["ccc"].size() == 2);
    BOOST_CHECK(testArgs.m_settings.command_line_options["ccc"].front().get_str() == "argument");
    BOOST_CHECK(testArgs.m_settings.command_line_options["ccc"].back().get_str() == "multiple");
    BOOST_CHECK(testArgs.GetArgs("-ccc").size() == 2);
}